

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O3

bool basisu::etc_block::unpack_color5
               (uint32_t *r,uint32_t *g,uint32_t *b,uint16_t packed_color5,uint16_t packed_delta3,
               bool scaled,uint32_t alpha)

{
  bool bVar1;
  undefined8 in_RAX;
  color_rgba result;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  bVar1 = unpack_color5((color_rgba *)((long)&uStack_28 + 4),packed_color5,packed_delta3,scaled,
                        alpha);
  *r = (uint)uStack_28._4_1_;
  *g = (uint)uStack_28._5_1_;
  *b = (uint)uStack_28._6_1_;
  return bVar1;
}

Assistant:

bool etc_block::unpack_color5(uint32_t& r, uint32_t& g, uint32_t& b, uint16_t packed_color5, uint16_t packed_delta3, bool scaled, uint32_t alpha)
	{
		color_rgba result;
		const bool success = unpack_color5(result, packed_color5, packed_delta3, scaled, alpha);
		r = result.r;
		g = result.g;
		b = result.b;
		return success;
	}